

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

void Ver_ParseInternal(Ver_Man_t *pMan)

{
  FILE *pFile;
  int iVar1;
  ProgressBar *pPVar2;
  char *__s1;
  Abc_Ntk_t *pNtk_00;
  int local_24;
  int i;
  char *pToken;
  Abc_Ntk_t *pNtk;
  Ver_Man_t *pMan_local;
  
  pFile = _stdout;
  iVar1 = Ver_StreamGetFileSize(pMan->pReader);
  pPVar2 = Extra_ProgressBarStart(pFile,iVar1);
  pMan->pProgress = pPVar2;
  while( true ) {
    __s1 = Ver_ParseGetName(pMan);
    if (__s1 == (char *)0x0) {
      Extra_ProgressBarStop(pMan->pProgress);
      pMan->pProgress = (ProgressBar *)0x0;
      iVar1 = Ver_ParseAttachBoxes(pMan);
      if (iVar1 == 0) {
        return;
      }
      local_24 = 0;
      while( true ) {
        iVar1 = Vec_PtrSize(pMan->pDesign->vModules);
        if (iVar1 <= local_24) {
          return;
        }
        pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(pMan->pDesign->vModules,local_24);
        Abc_NtkFinalizeRead(pNtk_00);
        if ((pMan->fCheck != 0) && (iVar1 = Abc_NtkCheckRead(pNtk_00), iVar1 == 0)) break;
        local_24 = local_24 + 1;
      }
      pMan->fTopLevel = 1;
      sprintf(pMan->sError,"The network check has failed for network %s.",pNtk_00->pName);
      Ver_ParsePrintErrorMessage(pMan);
      return;
    }
    iVar1 = strcmp(__s1,"module");
    if (iVar1 != 0) break;
    iVar1 = Ver_ParseModule(pMan);
    if (iVar1 == 0) {
      return;
    }
  }
  sprintf(pMan->sError,"Cannot read \"module\" directive.");
  Ver_ParsePrintErrorMessage(pMan);
  return;
}

Assistant:

void Ver_ParseInternal( Ver_Man_t * pMan )
{
    Abc_Ntk_t * pNtk;
    char * pToken;
    int i;

    // preparse the modeles
    pMan->pProgress = Extra_ProgressBarStart( stdout, Ver_StreamGetFileSize(pMan->pReader) );
    while ( 1 )
    {
        // get the next token
        pToken = Ver_ParseGetName( pMan );
        if ( pToken == NULL )
            break;
        if ( strcmp( pToken, "module" ) )
        {
            sprintf( pMan->sError, "Cannot read \"module\" directive." );
            Ver_ParsePrintErrorMessage( pMan );
            return;
        }
        // parse the module
        if ( !Ver_ParseModule(pMan) )
            return;
    }
    Extra_ProgressBarStop( pMan->pProgress );
    pMan->pProgress = NULL;

    // process defined and undefined boxes
    if ( !Ver_ParseAttachBoxes( pMan ) )
        return;

    // connect the boxes and check
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
    {
        // fix the dangling nets
        Abc_NtkFinalizeRead( pNtk );
        // check the network for correctness
        if ( pMan->fCheck && !Abc_NtkCheckRead( pNtk ) )
        {
            pMan->fTopLevel = 1;
            sprintf( pMan->sError, "The network check has failed for network %s.", pNtk->pName );
            Ver_ParsePrintErrorMessage( pMan );
            return;
        }
    }
}